

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCMakePresetsGraph.cxx
# Opt level: O2

ReadFileResult __thiscall
cmCMakePresetsGraph::ConfigurePreset::VisitPresetAfterInherit(ConfigurePreset *this,int version)

{
  size_type sVar1;
  allocator<char> local_39;
  key_type local_38;
  
  if ((this->super_Preset).Hidden == false) {
    if (version < 3) {
      if ((this->Generator)._M_string_length == 0) {
        return INVALID_PRESET;
      }
      if ((this->BinaryDir)._M_string_length == 0) {
        return INVALID_PRESET;
      }
    }
    if (((((this->WarnDev).super__Optional_base<bool,_true,_true>._M_payload.
           super__Optional_payload_base<bool>._M_engaged == true) &&
         ((this->WarnDev).super__Optional_base<bool,_true,_true>._M_payload.
          super__Optional_payload_base<bool>._M_payload._M_value == false)) &&
        ((this->ErrorDev).super__Optional_base<bool,_true,_true>._M_payload.
         super__Optional_payload_base<bool>._M_engaged == true)) &&
       ((this->ErrorDev).super__Optional_base<bool,_true,_true>._M_payload.
        super__Optional_payload_base<bool>._M_payload._M_value != false)) {
      return INVALID_PRESET;
    }
    if ((((this->WarnDeprecated).super__Optional_base<bool,_true,_true>._M_payload.
          super__Optional_payload_base<bool>._M_engaged == true) &&
        ((this->WarnDeprecated).super__Optional_base<bool,_true,_true>._M_payload.
         super__Optional_payload_base<bool>._M_payload._M_value == false)) &&
       (((this->ErrorDeprecated).super__Optional_base<bool,_true,_true>._M_payload.
         super__Optional_payload_base<bool>._M_engaged == true &&
        ((this->ErrorDeprecated).super__Optional_base<bool,_true,_true>._M_payload.
         super__Optional_payload_base<bool>._M_payload._M_value != false)))) {
      return INVALID_PRESET;
    }
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_38,"",&local_39);
    sVar1 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::optional<cmCMakePresetsGraph::CacheVariable>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::optional<cmCMakePresetsGraph::CacheVariable>_>_>_>
            ::count(&this->CacheVariables,&local_38);
    std::__cxx11::string::~string((string *)&local_38);
    if (sVar1 != 0) {
      return INVALID_PRESET;
    }
  }
  return READ_OK;
}

Assistant:

cmCMakePresetsGraph::ReadFileResult
cmCMakePresetsGraph::ConfigurePreset::VisitPresetAfterInherit(int version)
{
  auto& preset = *this;
  if (!preset.Hidden) {
    if (version < 3) {
      if (preset.Generator.empty()) {
        return ReadFileResult::INVALID_PRESET;
      }
      if (preset.BinaryDir.empty()) {
        return ReadFileResult::INVALID_PRESET;
      }
    }

    if (preset.WarnDev == false && preset.ErrorDev == true) {
      return ReadFileResult::INVALID_PRESET;
    }
    if (preset.WarnDeprecated == false && preset.ErrorDeprecated == true) {
      return ReadFileResult::INVALID_PRESET;
    }
    if (preset.CacheVariables.count("") != 0) {
      return ReadFileResult::INVALID_PRESET;
    }
  }

  return ReadFileResult::READ_OK;
}